

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O1

void __thiscall
Js::ScriptContext::FieldAccessStatsEntry::FieldAccessStatsEntry
          (FieldAccessStatsEntry *this,RecyclerWeakReference<Js::FunctionBody> *functionBodyWeakRef,
          Recycler *recycler)

{
  Type *addr;
  
  Memory::Recycler::WBSetBit((char *)this);
  (this->functionBodyWeakRef).ptr = functionBodyWeakRef;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  addr = &this->stats;
  (this->stats).super_SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>.
  super_SListNodeBase<Memory::Recycler>.next.ptr = (SListNodeBase<Memory::Recycler> *)0x0;
  (this->stats).super_SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>.super_RealCount
  .count = 0;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->stats).super_SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>.
  super_SListNodeBase<Memory::Recycler>.next.ptr = (SListNodeBase<Memory::Recycler> *)addr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  (this->stats).super_SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>.super_RealCount
  .count = 0;
  (this->stats).allocator = recycler;
  return;
}

Assistant:

FieldAccessStatsEntry(RecyclerWeakReference<FunctionBody>* functionBodyWeakRef, Recycler* recycler)
                : functionBodyWeakRef(functionBodyWeakRef), stats(recycler) {}